

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

double __thiscall
imrt::ApertureILS::improvementAperture
          (ApertureILS *this,int beamlet,Station *station,bool open_beamlet,double c_eval,Plan *P,
          bool best_improvement)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  ulong uVar4;
  byte in_CL;
  byte bVar5;
  Station *in_R8;
  byte in_R9B;
  Plan *in_XMM0_Qa;
  Plan *in_stack_00000050;
  double in_stack_00000058;
  Station *in_stack_00000060;
  int in_stack_0000006c;
  int in_stack_00000070;
  int in_stack_00000074;
  ApertureILS *in_stack_00000078;
  vector<int,_std::allocator<int>_> a_list;
  bool flag;
  int i;
  int local_rese8;
  int a;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double aux_eval;
  double local_best;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Plan *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffee4;
  Station *in_stack_fffffffffffffee8;
  Plan *in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  ApertureILS *in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> local_90;
  byte local_75;
  int local_74;
  int local_70;
  int local_6c;
  Plan *local_50;
  Plan *local_48;
  byte local_39;
  Plan *local_8;
  
  bVar5 = in_CL & 1;
  local_39 = in_R9B & 1;
  local_48 = (Plan *)0xbff0000000000000;
  local_50 = (Plan *)0x0;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16c3ac);
  local_75 = 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16c3c1);
  if (bVar5 == 0) {
    Station::getOpen(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0);
  }
  else {
    Station::getClosed(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0);
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_90);
  if (sVar2 == 0) {
    std::operator<<((ostream *)&std::cout,"[NOPT] ");
    local_8 = in_XMM0_Qa;
  }
  else {
    iVar1 = rand();
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_90);
    local_6c = (int)((ulong)(long)iVar1 % sVar2);
    local_74 = 0;
    while ((local_75 & 1) != 0) {
      if (bVar5 == 0) {
        std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_6c);
        local_50 = (Plan *)closeBeamlet(in_stack_00000078,in_stack_00000074,in_stack_00000070,
                                        in_stack_0000006c,in_stack_00000060,in_stack_00000058,
                                        in_stack_00000050);
      }
      else {
        std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_6c);
        local_50 = (Plan *)openBeamlet(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                                       in_stack_ffffffffffffff30,
                                       (Station *)
                                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                                       ,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      if (((double)local_48 < 0.0) || (1e-05 < (double)local_48 - (double)local_50)) {
        local_48 = local_50;
        local_70 = local_6c;
        local_74 = 0;
        if ((local_39 & 1) == 0) {
          local_8 = local_50;
          goto LAB_0016c851;
        }
      }
      Station::undoLast_abi_cxx11_(in_R8);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffec0,
                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16c697)
      ;
      sVar2 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              size(in_stack_fffffffffffffeb0);
      if (sVar2 != 0) {
        local_50 = (Plan *)Plan::incremental_eval
                                     (in_stack_fffffffffffffec0,
                                      (Station *)
                                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                      in_stack_fffffffffffffeb0);
      }
      local_74 = local_74 + 1;
      local_6c = local_6c + 1;
      sVar2 = (size_type)local_6c;
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_90);
      if (sVar2 == sVar3) {
        local_6c = 0;
      }
      uVar4 = (ulong)local_74;
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_90);
      if (sVar2 <= uVar4) {
        local_75 = 0;
      }
    }
    if (bVar5 == 0) {
      std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_70);
      in_stack_fffffffffffffec0 =
           (Plan *)closeBeamlet(in_stack_00000078,in_stack_00000074,in_stack_00000070,
                                in_stack_0000006c,in_stack_00000060,in_stack_00000058,
                                in_stack_00000050);
      local_48 = in_stack_fffffffffffffec0;
    }
    else {
      std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_70);
      local_48 = (Plan *)openBeamlet(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                                     in_stack_ffffffffffffff30,
                                     (Station *)
                                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                     in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    local_8 = local_48;
  }
LAB_0016c851:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16c86b);
  return (double)local_8;
}

Assistant:

double ApertureILS::improvementAperture(int beamlet, Station& station, bool open_beamlet, 
                                             double c_eval, Plan& P, bool best_improvement) {
  double local_best=-1, aux_eval=0;
  list<pair<int, double> > diff;
  int a, local_a, i;
  bool flag=true; 
  vector<int> a_list;
  
  if (!open_beamlet) a_list = station.getOpen(beamlet);
  else a_list = station.getClosed(beamlet);
  
  if (a_list.size()<1) {
    cout << "[NOPT] ";
    //cout << endl << "Warning: not possible to make aperture change beamlet:" << beamlet <<endl;
    return(c_eval);
  }
  
  a = (int)rand() % a_list.size();
  i = 0;
  
  // Check every aperture 
  while(flag) {
    if (!open_beamlet) {
      aux_eval = closeBeamlet(beamlet, 0, a_list[a], station, c_eval, P); 
    } else {
      aux_eval = openBeamlet(beamlet, a_list[a], station, c_eval, P);
    } 
    
    // First improvement
    if (local_best < 0 || (local_best-aux_eval) >0.00001){
      local_best = aux_eval;
      local_a =a ;
      i=0; // to support best improvement
      if (!best_improvement)
        return(local_best);
    } 
    
    diff = station.undoLast();
    if (diff.size()>0)
      aux_eval = P.incremental_eval(station, diff);
    i++;
    a++;
    if (a==a_list.size()) a=0;
    if (i>=a_list.size()) flag=false;
  }
  
  // If no improvement was found, return the best solution found.
  if (!open_beamlet) {
    local_best = closeBeamlet(beamlet, 0, a_list[local_a], station, c_eval, P);
  } else{
    local_best = openBeamlet(beamlet, a_list[local_a], station, c_eval, P);
  }
  return(local_best);
  
}